

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-loadavg.c
# Opt level: O1

int run_test_get_loadavg(void)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  size_t sVar6;
  undefined4 *puVar7;
  long extraout_RDX;
  addrinfo *ai;
  addrinfo *ai_00;
  long extraout_RDX_00;
  uv_getaddrinfo_t *req;
  uv_handle_t *handle;
  int *piVar8;
  long lVar9;
  double avg [3];
  uv_getaddrinfo_t uStack_288;
  uv_loop_t *puStack_1e8;
  uv_loop_t *puStack_1e0;
  uv_loop_t *puStack_1d8;
  uv_getaddrinfo_t uStack_1d0;
  uv_loop_t *puStack_130;
  code *pcStack_128;
  uv_getaddrinfo_t uStack_120;
  uv_loop_t *puStack_80;
  undefined1 auStack_70 [56];
  undefined1 *puStack_38;
  void *local_28;
  void *pvStack_20;
  void *local_18;
  
  local_28 = (void *)0xbff0000000000000;
  pvStack_20 = (void *)0xbff0000000000000;
  local_18 = (void *)0xbff0000000000000;
  uv_loadavg((double *)&local_28);
  if ((double)local_28 < 0.0) {
    run_test_get_loadavg_cold_3();
LAB_00158c6d:
    run_test_get_loadavg_cold_2();
  }
  else {
    if ((double)pvStack_20 < 0.0) goto LAB_00158c6d;
    if (0.0 <= (double)local_18) {
      return 0;
    }
  }
  run_test_get_loadavg_cold_1();
  auStack_70._40_8_ = (void *)0x158c81;
  puStack_38 = (undefined1 *)&local_28;
  puVar4 = (uv_loop_t *)uv_get_free_memory();
  auStack_70._40_8_ = (void *)0x158c89;
  puVar5 = (uv_loop_t *)uv_get_total_memory();
  auStack_70._40_8_ = (void *)0x158c91;
  uv_get_constrained_memory();
  auStack_70._40_8_ = (void *)0x158ca8;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",puVar4,puVar5);
  if (puVar4 == (uv_loop_t *)0x0) {
    auStack_70._40_8_ = (void *)0x158cc6;
    run_test_get_memory_cold_3();
LAB_00158cc6:
    auStack_70._40_8_ = (void *)0x158ccb;
    run_test_get_memory_cold_2();
  }
  else {
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_00158cc6;
    if (puVar4 < puVar5) {
      return 0;
    }
  }
  auStack_70._40_8_ = run_test_get_passwd;
  run_test_get_memory_cold_1();
  puStack_80 = (uv_loop_t *)0x158cdf;
  auStack_70._40_8_ = puVar4;
  iVar2 = uv_os_get_passwd((uv_passwd_t *)auStack_70);
  uVar1 = auStack_70._32_8_;
  if (iVar2 == 0) {
    if (*(char *)auStack_70._0_8_ == '\0') goto LAB_00158da3;
    if (*(char *)auStack_70._24_8_ == '\0') goto LAB_00158da8;
    puStack_80 = (uv_loop_t *)0x158d10;
    sVar6 = strlen((char *)auStack_70._32_8_);
    puVar4 = (uv_loop_t *)uVar1;
    if (sVar6 != 1) {
      if (sVar6 != 0) {
        if (*(char *)(uVar1 + (sVar6 - 1)) == '/') {
          puStack_80 = (uv_loop_t *)0x158d2b;
          run_test_get_passwd_cold_13();
          goto LAB_00158d2b;
        }
        goto LAB_00158d34;
      }
      goto LAB_00158dda;
    }
LAB_00158d2b:
    if (*(char *)uVar1 == '/') {
LAB_00158d34:
      if ((long)auStack_70._8_8_ < 0) goto LAB_00158dad;
      if ((long)auStack_70._16_8_ < 0) goto LAB_00158db2;
      puVar4 = (uv_loop_t *)auStack_70;
      puStack_80 = (uv_loop_t *)0x158d51;
      uv_os_free_passwd((uv_passwd_t *)puVar4);
      if ((char *)auStack_70._0_8_ != (char *)0x0) goto LAB_00158db7;
      if ((char *)auStack_70._24_8_ != (char *)0x0) goto LAB_00158dbc;
      if ((uv_loop_t *)auStack_70._32_8_ != (uv_loop_t *)0x0) goto LAB_00158dc1;
      puVar4 = (uv_loop_t *)auStack_70;
      puStack_80 = (uv_loop_t *)0x158d74;
      uv_os_free_passwd((uv_passwd_t *)puVar4);
      if ((char *)auStack_70._0_8_ != (char *)0x0) goto LAB_00158dc6;
      if ((char *)auStack_70._24_8_ != (char *)0x0) goto LAB_00158dcb;
      if ((uv_loop_t *)auStack_70._32_8_ != (uv_loop_t *)0x0) goto LAB_00158dd0;
      puStack_80 = (uv_loop_t *)0x158d91;
      iVar2 = uv_os_get_passwd((uv_passwd_t *)0x0);
      if (iVar2 == -0x16) {
        return 0;
      }
      goto LAB_00158dd5;
    }
  }
  else {
    puStack_80 = (uv_loop_t *)0x158da3;
    run_test_get_passwd_cold_1();
LAB_00158da3:
    puStack_80 = (uv_loop_t *)0x158da8;
    run_test_get_passwd_cold_15();
LAB_00158da8:
    puStack_80 = (uv_loop_t *)0x158dad;
    run_test_get_passwd_cold_14();
LAB_00158dad:
    puStack_80 = (uv_loop_t *)0x158db2;
    run_test_get_passwd_cold_4();
LAB_00158db2:
    puStack_80 = (uv_loop_t *)0x158db7;
    run_test_get_passwd_cold_5();
LAB_00158db7:
    puStack_80 = (uv_loop_t *)0x158dbc;
    run_test_get_passwd_cold_6();
LAB_00158dbc:
    puStack_80 = (uv_loop_t *)0x158dc1;
    run_test_get_passwd_cold_7();
LAB_00158dc1:
    puStack_80 = (uv_loop_t *)0x158dc6;
    run_test_get_passwd_cold_8();
LAB_00158dc6:
    puStack_80 = (uv_loop_t *)0x158dcb;
    run_test_get_passwd_cold_9();
LAB_00158dcb:
    puStack_80 = (uv_loop_t *)0x158dd0;
    run_test_get_passwd_cold_10();
LAB_00158dd0:
    puStack_80 = (uv_loop_t *)0x158dd5;
    run_test_get_passwd_cold_11();
LAB_00158dd5:
    puStack_80 = (uv_loop_t *)0x158dda;
    run_test_get_passwd_cold_12();
LAB_00158dda:
    puStack_80 = (uv_loop_t *)0x158ddf;
    run_test_get_passwd_cold_3();
  }
  puStack_80 = (uv_loop_t *)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar2 = (int)&uStack_120;
  pcStack_128 = (code *)0x158df1;
  puStack_80 = puVar4;
  puVar5 = uv_default_loop();
  pcStack_128 = (code *)0x158e0b;
  iVar3 = uv_getaddrinfo(puVar5,&uStack_120,abort,(char *)0x0,(char *)0x0,(addrinfo *)0x0);
  if (iVar3 == -0x16) {
    pcStack_128 = (code *)0x158e19;
    puVar5 = uv_default_loop();
    pcStack_128 = (code *)0x158e38;
    iVar2 = (int)&uStack_120;
    iVar3 = uv_getaddrinfo(puVar5,&uStack_120,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar3 != 0) goto LAB_00158e9c;
    pcStack_128 = (code *)0x158e41;
    puVar5 = uv_default_loop();
    iVar2 = 0;
    pcStack_128 = (code *)0x158e4b;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00158ea1;
    if (fail_cb_called != 1) goto LAB_00158ea6;
    pcStack_128 = (code *)0x158e5d;
    puVar4 = uv_default_loop();
    pcStack_128 = (code *)0x158e71;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    pcStack_128 = (code *)0x158e7b;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStack_128 = (code *)0x158e80;
    puVar5 = uv_default_loop();
    pcStack_128 = (code *)0x158e88;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_128 = (code *)0x158e9c;
    run_test_getaddrinfo_fail_cold_1();
LAB_00158e9c:
    pcStack_128 = (code *)0x158ea1;
    run_test_getaddrinfo_fail_cold_2();
LAB_00158ea1:
    pcStack_128 = (code *)0x158ea6;
    run_test_getaddrinfo_fail_cold_3();
LAB_00158ea6:
    pcStack_128 = (code *)0x158eab;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_128 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar2) goto LAB_00158ed7;
    if (extraout_RDX == 0) {
      puStack_130 = (uv_loop_t *)0x158eca;
      pcStack_128._0_4_ = extraout_EAX;
      uv_freeaddrinfo((addrinfo *)0x0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_128;
    }
  }
  else {
    puStack_130 = (uv_loop_t *)0x158ed7;
    getaddrinfo_fail_cb_cold_1();
LAB_00158ed7:
    puStack_130 = (uv_loop_t *)0x158edc;
    getaddrinfo_fail_cb_cold_2();
  }
  puStack_130 = (uv_loop_t *)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  puStack_1d8 = (uv_loop_t *)0x158eee;
  puStack_130 = puVar4;
  puVar5 = uv_default_loop();
  puStack_1d8 = (uv_loop_t *)0x158f08;
  iVar2 = uv_getaddrinfo(puVar5,&uStack_1d0,(uv_getaddrinfo_cb)0x0,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 < 0) {
    puStack_1d8 = (uv_loop_t *)0x158f19;
    uv_freeaddrinfo(uStack_1d0.addrinfo);
    puStack_1d8 = (uv_loop_t *)0x158f1e;
    puVar4 = uv_default_loop();
    puStack_1d8 = (uv_loop_t *)0x158f32;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_1d8 = (uv_loop_t *)0x158f3c;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_1d8 = (uv_loop_t *)0x158f41;
    puVar5 = uv_default_loop();
    puStack_1d8 = (uv_loop_t *)0x158f49;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_1d8 = (uv_loop_t *)0x158f5d;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  puStack_1d8 = (uv_loop_t *)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  puStack_1e0 = (uv_loop_t *)0x158f6d;
  puStack_1d8 = puVar4;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  puStack_1e0 = (uv_loop_t *)0x158f79;
  puVar5 = uv_default_loop();
  puStack_1e0 = (uv_loop_t *)0x158f9c;
  iVar2 = uv_getaddrinfo(puVar5,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    puStack_1e0 = (uv_loop_t *)0x158fa5;
    puVar5 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x158faf;
    uv_run(puVar5,UV_RUN_DEFAULT);
    if (getaddrinfo_cbs != 1) goto LAB_00158ff5;
    puStack_1e0 = (uv_loop_t *)0x158fbd;
    puVar4 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x158fd1;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_1e0 = (uv_loop_t *)0x158fdb;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_1e0 = (uv_loop_t *)0x158fe0;
    puVar5 = uv_default_loop();
    puStack_1e0 = (uv_loop_t *)0x158fe8;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_1e0 = (uv_loop_t *)0x158ff5;
    run_test_getaddrinfo_basic_cold_1();
LAB_00158ff5:
    puStack_1e0 = (uv_loop_t *)0x158ffa;
    run_test_getaddrinfo_basic_cold_2();
  }
  puStack_1e0 = (uv_loop_t *)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  puStack_1e0 = puVar4;
  if ((uv_loop_t *)getaddrinfo_handle == puVar5) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    puStack_1e8 = (uv_loop_t *)0x159017;
    free(puVar5);
    uv_freeaddrinfo(ai);
    return extraout_EAX_00;
  }
  puStack_1e8 = (uv_loop_t *)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  puStack_1e8 = puVar4;
  puVar4 = uv_default_loop();
  iVar2 = uv_getaddrinfo(puVar4,&uStack_288,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    uv_freeaddrinfo(uStack_288.addrinfo);
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  req = getaddrinfo_handles;
  piVar8 = callback_counts;
  lVar9 = 0;
  do {
    *piVar8 = 0;
    puVar4 = (uv_loop_t *)0x4;
    puVar7 = (undefined4 *)malloc(4);
    if (puVar7 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_00159194:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_00159199;
    }
    *puVar7 = (int)lVar9;
    req->data = puVar7;
    puVar4 = uv_default_loop();
    iVar2 = uv_getaddrinfo(puVar4,req,getaddrinfo_cuncurrent_cb,"localhost",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar2 != 0) goto LAB_00159194;
    lVar9 = lVar9 + 1;
    req = req + 1;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 10);
  puVar4 = uv_default_loop();
  lVar9 = 0;
  uv_run(puVar4,UV_RUN_DEFAULT);
  do {
    if (*(int *)((long)callback_counts + lVar9) != 1) goto LAB_00159199;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x28);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
LAB_0015919e:
  run_test_getaddrinfo_concurrent_cold_3();
  handle = (uv_handle_t *)puVar4->data;
  piVar8 = callback_counts;
  puVar5 = (uv_loop_t *)&closedir_req.bufsml[1].len;
  lVar9 = 0;
  do {
    puVar5 = (uv_loop_t *)((puVar5->wq_mutex).__size + 0x18);
    if (puVar5 == puVar4) goto LAB_001591db;
    piVar8 = piVar8 + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar9 = extraout_RDX_00;
LAB_001591db:
  if (*(int *)&handle->data == (int)lVar9) {
    *piVar8 = *piVar8 + 1;
    free(handle);
    uv_freeaddrinfo(ai_00);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return extraout_EAX_01;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
LAB_00159199:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015919e;
}

Assistant:

TEST_IMPL(get_loadavg) {

  double avg[3] = {-1, -1, -1};
  uv_loadavg(avg);

  ASSERT(avg[0] >= 0);
  ASSERT(avg[1] >= 0);
  ASSERT(avg[2] >= 0);

  return 0;
}